

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O0

void __thiscall helics::TranslatorFederate::~TranslatorFederate(TranslatorFederate *this)

{
  TimeCoordinator *in_RDI;
  nullptr_t pvVar1;
  
  *(undefined8 *)
   &in_RDI[1].super_BaseTimeCoordinator.sendMessageFunction.super__Function_base._M_functor = 0;
  in_RDI[1].super_BaseTimeCoordinator.sendMessageFunction.super__Function_base._M_functor.
  _M_pod_data[8] = '\0';
  pvVar1 = (nullptr_t)0x0;
  std::function<void_(const_helics::ActionMessage_&)>::operator=
            ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,(nullptr_t)0x0);
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)in_RDI,pvVar1);
  std::function<void_(const_helics::ActionMessage_&)>::operator=
            ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,pvVar1);
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)in_RDI,pvVar1);
  std::function<void_(helics::ActionMessage_&)>::operator=
            ((function<void_(helics::ActionMessage_&)> *)in_RDI,pvVar1);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator=((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)in_RDI,pvVar1);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  operator=((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)in_RDI,pvVar1);
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::clear
            ((MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *)in_RDI);
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::
  ~MappedPointerVector((MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *)in_RDI);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  ~function((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)0x68df5c);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x68df6d);
  std::function<void_(helics::ActionMessage_&)>::~function
            ((function<void_(helics::ActionMessage_&)> *)0x68df7e);
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x68df8f);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x68dfa0);
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x68dfb1);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x68dfc2);
  TimeCoordinator::~TimeCoordinator(in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return;
}

Assistant:

TranslatorFederate::~TranslatorFederate()
{
    mHandles = nullptr;
    current_state = FederateStates::CREATED;

    mQueueMessage = nullptr;
    mQueueMessageMove = nullptr;
    mSendMessage = nullptr;
    mSendMessageMove = nullptr;
    mDeliverMessage = nullptr;

    mLogger = nullptr;
    mGetAirLock = nullptr;

    translators.clear();
}